

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O2

void o3dgc::ComputeVectorMinMax
               (Real *tab,unsigned_long size,unsigned_long dim,unsigned_long stride,Real *minTab,
               Real *maxTab,O3DGCSC3DMCQuantizationMode quantMode)

{
  Real RVar1;
  float fVar2;
  unsigned_long d_1;
  unsigned_long uVar3;
  Real *pRVar4;
  unsigned_long uVar5;
  float fVar6;
  
  if (dim != 0 && size != 0) {
    for (uVar3 = 0; dim != uVar3; uVar3 = uVar3 + 1) {
      RVar1 = tab[uVar3];
      minTab[uVar3] = RVar1;
      maxTab[uVar3] = RVar1;
    }
    pRVar4 = tab + stride;
    for (uVar3 = 1; uVar3 != size; uVar3 = uVar3 + 1) {
      for (uVar5 = 0; dim != uVar5; uVar5 = uVar5 + 1) {
        fVar6 = pRVar4[uVar5];
        if (maxTab[uVar5] <= fVar6 && fVar6 != maxTab[uVar5]) {
          maxTab[uVar5] = fVar6;
          fVar6 = pRVar4[uVar5];
        }
        if (fVar6 < minTab[uVar5]) {
          minTab[uVar5] = fVar6;
        }
      }
      pRVar4 = pRVar4 + stride;
    }
    if (quantMode == O3DGC_SC3DMC_MAX_ALL_DIMS) {
      fVar6 = *maxTab - *minTab;
      for (uVar3 = 1; dim != uVar3; uVar3 = uVar3 + 1) {
        fVar2 = maxTab[uVar3] - minTab[uVar3];
        if (maxTab[uVar3] - minTab[uVar3] <= fVar6) {
          fVar2 = fVar6;
        }
        fVar6 = fVar2;
      }
      for (uVar3 = 0; dim != uVar3; uVar3 = uVar3 + 1) {
        maxTab[uVar3] = minTab[uVar3] + fVar6;
      }
    }
    else if (quantMode == O3DGC_SC3DMC_DIAG_BB) {
      fVar6 = 0.0;
      for (uVar3 = 0; dim != uVar3; uVar3 = uVar3 + 1) {
        fVar6 = fVar6 + (maxTab[uVar3] - minTab[uVar3]) * (maxTab[uVar3] - minTab[uVar3]);
      }
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      for (uVar3 = 0; dim != uVar3; uVar3 = uVar3 + 1) {
        maxTab[uVar3] = minTab[uVar3] + fVar6;
      }
    }
  }
  return;
}

Assistant:

inline void ComputeVectorMinMax(const Real * const tab, 
                                    unsigned long size, 
                                    unsigned long dim,
                                    unsigned long stride,
                                    Real * minTab,
                                    Real * maxTab,
                                    O3DGCSC3DMCQuantizationMode quantMode)
    {
        if (size == 0 || dim == 0)
        {
            return;
        }
        unsigned long p = 0;
        for(unsigned long d = 0; d < dim; ++d)
        {
            maxTab[d] = minTab[d] = tab[p++];
        }
        p = stride;
        for(unsigned long i = 1; i < size; ++i)
        {
            for(unsigned long d = 0; d < dim; ++d)
            {
                if (maxTab[d] < tab[p+d]) maxTab[d] = tab[p+d];
                if (minTab[d] > tab[p+d]) minTab[d] = tab[p+d];
            }
            p += stride;
        }

        if (quantMode == O3DGC_SC3DMC_DIAG_BB)
        {
            Real diag = Real( 0.0 );
            Real r;
            for(unsigned long d = 0; d < dim; ++d)
            {
                r     = (maxTab[d] - minTab[d]);
                diag += r*r;
            } 
            diag = static_cast<Real>(sqrt(diag));
            for(unsigned long d = 0; d < dim; ++d)
            {
                 maxTab[d] = minTab[d] + diag;
            } 
        }
        else if (quantMode == O3DGC_SC3DMC_MAX_ALL_DIMS)
        {            
            Real maxr = (maxTab[0] - minTab[0]);
            Real r;
            for(unsigned long d = 1; d < dim; ++d)
            {
                r = (maxTab[d] - minTab[d]);
                if ( r > maxr)
                {
                    maxr = r;
                }
            } 
            for(unsigned long d = 0; d < dim; ++d)
            {
                 maxTab[d] = minTab[d] + maxr;
            } 
        }
    }